

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O1

bool __thiscall Shell::TermAlgebra::finiteDomain(TermAlgebra *this)

{
  OperatorType *pOVar1;
  ulong n;
  bool bVar2;
  bool bVar3;
  
  bVar3 = this->_n == 0;
  if (!bVar3) {
    n = 0;
    do {
      if ((this->_constrs)._capacity <= n) {
        ::Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(&this->_constrs,n);
      }
      pOVar1 = (this->_constrs)._array[n]->_type;
      if ((pOVar1->_typeArgsArity - 1) + *(int *)pOVar1->_key != 0) {
        return bVar3;
      }
      n = n + 1;
      bVar2 = (uint)n < this->_n;
      bVar3 = !bVar2;
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

bool TermAlgebra::finiteDomain()
{
  for (unsigned i = 0; i < _n; i++) {
    if (_constrs[i]->arity() > 0) {
      return false;
    }
  }

  return true;
}